

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

bool IsAfter(VmInstruction *a,VmInstruction *b)

{
  if (a->parent == b->parent) {
    for (; (b != a && (b != (VmInstruction *)0x0)); b = b->nextSibling) {
    }
    return b != (VmInstruction *)0x0;
  }
  __assert_fail("a->parent == b->parent",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0x1b8c,"bool IsAfter(VmInstruction *, VmInstruction *)");
}

Assistant:

bool IsAfter(VmInstruction *a, VmInstruction *b)
{
	assert(a->parent == b->parent);

	while(b)
	{
		if(a == b)
			return true;

		b = b->nextSibling;
	}

	return false;
}